

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

AActor * P_LineAttack(AActor *t1,DAngle *angle,double distance,DAngle *pitch,int damage,
                     FName *damageType,PClassActor *pufftype,int flags,FTranslatedLineTarget *victim
                     ,int *actualdamage)

{
  player_t *ppVar1;
  AWeapon *pAVar2;
  double dVar3;
  int damage_00;
  undefined1 auVar4 [16];
  byte bVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  DWORD flags_00;
  int iVar9;
  PClassActor *pPVar10;
  AActor *pAVar11;
  long lVar12;
  byte bVar13;
  BYTE *pBVar14;
  AActor *pAVar15;
  uint uVar16;
  bool bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  AActor *local_248;
  undefined4 local_240;
  ushort local_23c;
  undefined2 local_23a;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  uint local_20c;
  uint *local_208;
  FName *local_200;
  DVector3 local_1f8;
  double local_1e0;
  undefined1 local_1d8 [16];
  DAngle *local_1c8;
  double local_1c0;
  FName local_1b8;
  FName local_1b4;
  FSoundID local_1b0;
  ActorFlags local_1ac;
  FTraceResults trace;
  DVector2 ofs;
  DVector3 local_c8;
  DAngle local_b0;
  DAngle local_a8;
  DAngle local_a0;
  DAngle local_98;
  DAngle local_90;
  DAngle local_88;
  DAngle local_80;
  DAngle local_78;
  DAngle local_70;
  DAngle local_68;
  DAngle local_60;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  if (victim != (FTranslatedLineTarget *)0x0) {
    (victim->attackAngleFromSource).Degrees = 0.0;
    *(undefined8 *)&victim->unlinked = 0;
    victim->linetarget = (AActor *)0x0;
    (victim->angleFromSource).Degrees = 0.0;
  }
  if (actualdamage != (int *)0x0) {
    *actualdamage = 0;
  }
  local_248 = t1;
  local_200 = damageType;
  local_1c0 = distance;
  dVar3 = FFastTrig::cos(&fasttrig,pitch->Degrees * 11930464.711111112 + 6755399441055744.0);
  local_228._8_4_ = extraout_XMM0_Dc;
  local_228._0_8_ = dVar3;
  local_228._12_4_ = extraout_XMM0_Dd;
  dVar3 = FFastTrig::cos(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
  local_238._8_4_ = extraout_XMM0_Dc_00;
  local_238._0_8_ = dVar3;
  local_238._12_4_ = extraout_XMM0_Dd_00;
  dVar3 = FFastTrig::sin(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
  local_1d8._8_4_ = extraout_XMM0_Dc_01;
  local_1d8._0_8_ = dVar3;
  local_1d8._12_4_ = extraout_XMM0_Dd_01;
  local_c8.Z = FFastTrig::sin(&fasttrig,pitch->Degrees * 11930464.711111112 + 6755399441055744.0);
  auVar4 = local_1d8;
  local_c8.Z = -local_c8.Z;
  local_c8.X = (double)local_238._0_8_ * (double)local_228._0_8_;
  local_c8.Y = (double)local_1d8._0_8_ * (double)local_228._0_8_;
  ppVar1 = t1->player;
  local_20c = 2;
  if (ppVar1 == (player_t *)0x0) {
    bVar17 = true;
    local_1e0 = 8.0;
  }
  else {
    local_1e0 = ppVar1->mo->AttackZOffset * ppVar1->crouchfactor;
    if ((local_200->Index == 0xcd) || (local_200->Index == 0x89)) {
      local_20c = 0x22;
      bVar17 = false;
    }
    else {
      bVar17 = true;
    }
  }
  local_1d8._4_4_ = 0;
  local_1d8._0_4_ = flags * 8 & 0x10;
  local_1d8._8_8_ = auVar4._8_8_;
  local_228._0_8_ = (t1->Height * 0.5 + (t1->__Pos).Z) - t1->Floorclip;
  local_1c8 = pitch;
  pPVar10 = PClassActor::GetReplacement(pufftype,true);
  pBVar14 = (pPVar10->super_PClass).Defaults;
  local_238._0_8_ = pBVar14;
  uVar18 = local_228._0_4_;
  uVar19 = local_228._4_4_;
  if (((t1->player == (player_t *)0x0) ||
      (pAVar2 = t1->player->ReadyWeapon, pAVar2 == (AWeapon *)0x0)) ||
     (((pAVar2->super_AStateProvider).super_AInventory.super_AActor.flags2.Value & 0x4000) == 0)) {
    if (pBVar14 != (BYTE *)0x0) {
      bVar5 = (byte)(*(uint *)(pBVar14 + 0x1c0) >> 0xe) & 1;
      goto LAB_00410fe6;
    }
    local_23c = 0;
    if ((DAT_000001d6 & 0x40) != 0) goto LAB_004110af;
LAB_00411068:
    local_208 = (uint *)0x1d4;
    bVar5 = 0;
    bVar13 = 0;
LAB_0041106d:
    local_240 = 0;
    local_23a = 0;
  }
  else {
    bVar5 = 1;
    if (pBVar14 == (BYTE *)0x0) {
      local_23c = 1;
      if ((DAT_000001d6 & 0x40) == 0) goto LAB_00411068;
LAB_004110af:
      local_208 = (uint *)0x1d4;
      bVar6 = 0;
      bVar13 = 0;
      bVar5 = 0;
      bVar7 = 0;
    }
    else {
LAB_00410fe6:
      bVar13 = (byte)(*(uint *)(pBVar14 + 0x1c4) >> 0xe) & 1;
      local_23c = CONCAT11(pBVar14[0x1d0] >> 2,bVar5) & 0x1ff;
      local_208 = (uint *)(pBVar14 + 0x1d4);
      bVar5 = 1;
      if ((pBVar14[0x1d6] & 0x40) == 0) goto LAB_0041106d;
      bVar6 = pBVar14[0x1d0] >> 1 & 1;
      bVar7 = (byte)(*(uint *)(pBVar14 + 0x1c0) >> 0x14) & 1;
      bVar5 = 1;
    }
    local_240 = 0;
    local_23a = CONCAT11(bVar7,bVar6);
    trace.Sector = (sector_t *)(t1->__Pos).X;
    trace._8_8_ = (t1->__Pos).Y;
    trace.HitPos.X = (t1->__Pos).Z;
    pAVar11 = AActor::StaticSpawn(pufftype,(DVector3 *)&trace,ALLOW_REPLACE,false);
    if (pAVar11 != (AActor *)0x0) {
      AActor::GetSpecies((AActor *)&trace);
      local_240 = trace.Sector._0_4_;
      (*(pAVar11->super_DThinker).super_DObject._vptr_DObject[4])(pAVar11);
    }
    uVar18 = local_228._0_4_;
    uVar19 = local_228._4_4_;
    pBVar14 = (BYTE *)local_238._0_8_;
  }
  local_1f8.Z = (double)CONCAT44(uVar19,uVar18) + local_1e0;
  iVar9 = local_200->Index;
  if ((iVar9 == 0) || (iVar9 == 0x89)) {
    if (bVar5 != 0) goto LAB_0041116d;
    flags_00 = (uint)((flags & 8U) == 0) * 4 + 1;
    bVar6 = 0;
  }
  else {
    if ((bVar5 & iVar9 == 0xcd) != 0) {
LAB_0041116d:
      if (*(int *)(pBVar14 + 0x404) != 0) {
        local_200->Index = *(int *)(pBVar14 + 0x404);
      }
    }
    bVar6 = (byte)((flags & 8U) >> 3);
    if (bVar5 == 1 && bVar6 == 0) {
      flags_00 = (uint)((pBVar14[0x1d2] & 1) == 0) * 4 + 1;
      bVar6 = 1;
    }
    else {
      bVar6 = bVar6 & bVar5;
      flags_00 = (uint)((flags & 8U) == 0) * 4 + 1;
    }
  }
  uVar16 = local_1d8._0_4_ + (flags & 1U) * 2;
  local_1f8.X = (t1->__Pos).X;
  local_1f8.Y = (t1->__Pos).Y;
  local_1ac.Value = 4;
  bVar8 = Trace(&local_1f8,(sector_t_conflict *)t1->Sector,&local_c8,local_1c0,&local_1ac,0x8008000,
                t1,&trace,flags_00,CheckForActor,&local_248);
  if (bVar8) {
    if (trace.HitType == TRACE_HitActor) {
      local_1f8.X = trace.HitPos.X;
      local_1f8.Y = trace.HitPos.Y;
      local_1f8.Z = trace.HitPos.Z;
      if ((i_compatflags._3_1_ & 0x10) != 0) {
        P_GetOffsetPosition(trace.HitPos.X,trace.HitPos.Y,trace.HitVector.X * -10.0,
                            trace.HitVector.Y * -10.0);
        local_1f8.X = ofs.X;
        local_1f8.Y = ofs.Y;
        local_1f8.Z = trace.HitVector.Z * 10.0 + local_1f8.Z;
      }
      if (((flags & 8U) == 0) &&
         ((((bVar6 == 0 || ((*(byte *)(local_238._0_8_ + 0x1c7) & 0x40) == 0)) &&
           ((((trace.Actor)->flags).Value & 0x80000) == 0)) &&
          ((((trace.Actor)->flags2).Value & 0x18000000) == 0)))) {
        local_228._0_8_ = CONCAT44(0,uVar16);
        pAVar11 = (AActor *)0x0;
      }
      else {
        local_228._0_4_ = (uVar16 | ((trace.Actor)->flags).Value >> 0x10 & 8) ^ 8;
        local_228._4_4_ = 0;
        local_58.Degrees = trace.SrcAngleFromTarget.Degrees;
        local_60.Degrees = trace.SrcAngleFromTarget.Degrees + -90.0;
        pAVar11 = P_SpawnPuff(t1,pufftype,&local_1f8,&local_58,&local_60,2,local_228._0_4_ | 1,
                              trace.Actor);
        if ((flags & 8U) != 0) {
          return pAVar11;
        }
      }
      if (bVar6 == 0) {
        iVar9 = 0;
        if (damage != 0) goto LAB_0041162e;
        bVar8 = true;
        bVar17 = false;
LAB_00411836:
        ppVar1 = t1->player;
        if (((t1->flags5).Value & 0x100) == 0) {
          if (ppVar1 != (player_t *)0x0) {
            if (ppVar1->ReadyWeapon == (AWeapon *)0x0) {
              bVar5 = 0;
            }
            else {
              bVar5 = ((ppVar1->ReadyWeapon->super_AStateProvider).super_AInventory.field_0x4fc & 8)
                      >> 3;
            }
LAB_00411882:
            if (ppVar1->ReadyWeapon == (AWeapon *)0x0) {
              if (bVar5 != 0) goto LAB_004118ad;
            }
            else {
              bVar13 = ((ppVar1->ReadyWeapon->super_AStateProvider).super_AInventory.field_0x4fc & 8
                       ) >> 3;
              if (bVar5 != 0 || bVar13 != 0) goto LAB_004118af;
            }
          }
          if (((((trace.Actor)->flags).Value & 0x80000) == 0) &&
             ((((trace.Actor)->flags2).Value & 0x18000000) == 0)) {
            local_80.Degrees = trace.SrcAngleFromTarget.Degrees;
            damage_00 = damage;
            if (0 < iVar9) {
              damage_00 = iVar9;
            }
            P_SpawnBlood(&local_1f8,&local_80,damage_00,trace.Actor);
          }
          if (!bVar8) {
LAB_0041199c:
            if (0 < iVar9) {
              damage = iVar9;
            }
            local_98.Degrees = trace.SrcAngleFromTarget.Degrees;
            local_a0.Degrees = local_1c8->Degrees;
            P_TraceBleed(damage,&trace.HitPos,trace.Actor,&local_98,&local_a0);
          }
        }
        else {
          bVar5 = 1;
          if (ppVar1 != (player_t *)0x0) goto LAB_00411882;
LAB_004118ad:
          bVar13 = 0;
LAB_004118af:
          if (!bVar8) {
            if (((((trace.Actor)->flags).Value & 0x80000) == 0) &&
               ((((trace.Actor)->flags2).Value & 0x18000000) == 0)) {
              if (bVar13 != 0) {
                local_88.Degrees = trace.SrcAngleFromTarget.Degrees;
                P_BloodSplatter2(&local_1f8,trace.Actor,&local_88);
              }
              uVar16 = FRandom::GenRand32(&pr_lineattack);
              if ((~uVar16 & 0xc0) != 0) {
                local_90.Degrees = trace.SrcAngleFromTarget.Degrees;
                P_BloodSplatter(&local_1f8,trace.Actor,&local_90);
              }
            }
            goto LAB_0041199c;
          }
        }
      }
      else {
        if (0 < *(int *)(local_238._0_8_ + 0x360)) {
          pAVar15 = pAVar11;
          if (pAVar11 == (AActor *)0x0) {
            pAVar15 = t1;
          }
          local_1b4.Index = *(int *)(local_238._0_8_ + 0x364);
          P_PoisonMobj(trace.Actor,pAVar15,t1,*(int *)(local_238._0_8_ + 0x360),
                       *(int *)(local_238._0_8_ + 0x368),*(int *)(local_238._0_8_ + 0x36c),
                       &local_1b4);
        }
        if (damage == 0) {
          bVar8 = true;
          if ((*(byte *)(local_238._0_8_ + 0x1d0) & 8) != 0) goto LAB_00411630;
          bVar8 = true;
          iVar9 = 0;
          if ((*local_208 & 0x400) != 0) goto LAB_00411630;
          bVar17 = false;
          lVar12 = local_238._0_8_;
          bVar8 = true;
        }
        else {
LAB_0041162e:
          bVar8 = false;
LAB_00411630:
          if ((!bVar17 && t1->player != (player_t *)0x0) &&
             (pAVar2 = t1->player->ReadyWeapon, pAVar2 != (AWeapon *)0x0)) {
            local_20c = local_20c |
                        (pAVar2->super_AStateProvider).super_AInventory.super_AActor.flags5.Value >>
                        0xb & 1;
          }
          bVar17 = pAVar11 == (AActor *)0x0;
          if (bVar17) {
            local_68.Degrees = 0.0;
            local_70.Degrees = 0.0;
            pAVar11 = P_SpawnPuff(t1,pufftype,&local_1f8,&local_68,&local_70,2,local_228._0_4_ | 5,
                                  (AActor *)0x0);
          }
          pAVar15 = pAVar11;
          if (pAVar11 == (AActor *)0x0) {
            pAVar15 = t1;
          }
          local_1b8.Index = local_200->Index;
          local_78.Degrees = trace.SrcAngleFromTarget.Degrees;
          iVar9 = P_DamageMobj(trace.Actor,pAVar15,t1,damage,&local_1b8,local_20c | 0x200,&local_78)
          ;
          if (actualdamage != (int *)0x0) {
            *actualdamage = iVar9;
          }
          lVar12 = local_238._0_8_;
          if (bVar6 == 0) goto LAB_00411836;
        }
        if ((*(byte *)(lVar12 + 0x1c7) & 8) == 0) goto LAB_00411836;
      }
      if (victim != (FTranslatedLineTarget *)0x0) {
        victim->linetarget = trace.Actor;
        uVar18 = SUB84(trace.SrcAngleFromTarget.Degrees,0);
        uVar19 = (undefined4)((ulong)trace.SrcAngleFromTarget.Degrees >> 0x20);
        (victim->attackAngleFromSource).Degrees = trace.SrcAngleFromTarget.Degrees;
        if (trace.unlinked == false) {
          AActor::AngleTo((AActor *)&ofs,t1,SUB81(trace.Actor,0));
          uVar18 = SUB84(ofs.X,0);
          uVar19 = (undefined4)((ulong)ofs.X >> 0x20);
        }
        (victim->angleFromSource).Degrees = (double)CONCAT44(uVar19,uVar18);
        victim->unlinked = trace.unlinked;
      }
    }
    else {
      local_228._0_8_ = CONCAT44(0,uVar16);
      if ((trace.HitType == TRACE_HitWall && (flags & 8U) == 0) &&
         ((~bVar13 & (trace.Line)->special == 9) != 0)) {
        pAVar11 = (AActor *)0x0;
LAB_0041174f:
        trace.HitType = TRACE_HitWall;
        if ((trace.Line)->special == 9) goto LAB_00411762;
        bVar17 = true;
        if ((trace.Line)->portalindex < linePortals.Count) {
          bVar17 = (linePortals.Array[(trace.Line)->portalindex].mFlags & 1) == 0;
        }
        if ((((flags & 4U) != 0) || (!bVar17)) || ((*local_208 >> 0x12 & 1) != 0))
        goto LAB_00411762;
        pAVar15 = t1;
        if ((t1->DecalGenerator == (FDecalBase *)0x0) &&
           (((t1->player == (player_t *)0x0 ||
             (pAVar2 = t1->player->ReadyWeapon, pAVar2 == (AWeapon *)0x0)) ||
            ((pAVar2->super_AStateProvider).super_AInventory.super_AActor.DecalGenerator ==
             (FDecalBase *)0x0)))) {
          if (pAVar11 != (AActor *)0x0) {
LAB_00411b0f:
            if (pAVar11->DecalGenerator != (FDecalBase *)0x0) {
              pAVar15 = pAVar11;
            }
          }
        }
        else if ((pAVar11 != (AActor *)0x0) && ((*local_208 & 0x80000) != 0)) goto LAB_00411b0f;
        SpawnShootDecal(pAVar15,&trace);
        bVar17 = false;
      }
      else {
        P_GetOffsetPosition(trace.HitPos.X,trace.HitPos.Y,trace.HitVector.X * -4.0,
                            trace.HitVector.Y * -4.0);
        local_1f8.Z = trace.HitVector.Z * -4.0 + trace.HitPos.Z;
        local_1f8.X = ofs.X;
        local_1f8.Y = ofs.Y;
        local_48.Degrees = trace.SrcAngleFromTarget.Degrees;
        local_50.Degrees = trace.SrcAngleFromTarget.Degrees + -90.0;
        pAVar11 = P_SpawnPuff(t1,pufftype,&local_1f8,&local_48,&local_50,0,uVar16,(AActor *)0x0);
        pAVar11->radius = 1.52587890625e-05;
        if ((flags & 8U) != 0) {
          return pAVar11;
        }
        if (trace.HitType == TRACE_HitWall) goto LAB_0041174f;
LAB_00411762:
        bVar17 = false;
        if ((pAVar11 != (AActor *)0x0) && (trace.CrossedWater == (sector_t *)0x0)) {
          bVar17 = false;
          if ((trace.HitType == TRACE_HitFloor) &&
             (bVar17 = false, (trace.Sector)->heightsec == (sector_t *)0x0)) {
            bVar17 = false;
            P_HitWater(pAVar11,trace.Sector,&trace.HitPos,false,true,false);
          }
        }
      }
    }
    if (trace.CrossedWater != (sector_t *)0x0 || trace.Crossed3DWater != (F3DFloor *)0x0) {
      if (pAVar11 == (AActor *)0x0) {
        local_a8.Degrees = 0.0;
        local_b0.Degrees = 0.0;
        pAVar11 = P_SpawnPuff(t1,pufftype,&trace.HitPos,&local_a8,&local_b0,2,local_228._0_4_ | 5,
                              (AActor *)0x0);
        bVar17 = true;
      }
      SpawnDeepSplash(t1,&trace,pAVar11);
    }
    if (pAVar11 == (AActor *)0x0) {
      return (AActor *)0x0;
    }
    if (!bVar17) {
      return pAVar11;
    }
    (*(pAVar11->super_DThinker).super_DObject._vptr_DObject[4])(pAVar11);
LAB_00411acc:
    pAVar11 = (AActor *)0x0;
  }
  else {
    if (((flags & 8U) == 0 & bVar6) == 1) {
      if (*(int *)(local_238._0_8_ + 0x3d4) != 0) {
        local_1b0.ID = *(int *)(local_238._0_8_ + 0x3d4);
        S_Sound(t1,1,&local_1b0,1.0,1.0);
      }
LAB_004115c3:
      if ((bVar6 == 0) || ((*(byte *)(local_238._0_8_ + 0x1c4) & 0x10) == 0)) goto LAB_00411acc;
    }
    else if ((flags & 8U) == 0) goto LAB_004115c3;
    local_38.Degrees = trace.SrcAngleFromTarget.Degrees;
    local_40.Degrees = trace.SrcAngleFromTarget.Degrees;
    pAVar11 = P_SpawnPuff(t1,pufftype,&trace.HitPos,&local_38,&local_40,2,uVar16,(AActor *)0x0);
  }
  return pAVar11;
}

Assistant:

AActor *P_LineAttack(AActor *t1, DAngle angle, double distance,
	DAngle pitch, int damage, FName damageType, PClassActor *pufftype, int flags, FTranslatedLineTarget*victim, int *actualdamage)
{
	bool nointeract = !!(flags & LAF_NOINTERACT);
	DVector3 direction;
	double shootz;
	FTraceResults trace;
	Origin TData;
	TData.Caller = t1;
	bool killPuff = false;
	AActor *puff = NULL;
	int pflag = 0;
	int puffFlags = (flags & LAF_ISMELEEATTACK) ? PF_MELEERANGE : 0;
	bool spawnSky = false;
	if (flags & LAF_NORANDOMPUFFZ)
		puffFlags |= PF_NORANDOMZ;

	if (victim != NULL)
	{
		memset(victim, 0, sizeof(*victim));
	}
	if (actualdamage != NULL)
	{
		*actualdamage = 0;
	}

	double pc = pitch.Cos();

	direction = { pc * angle.Cos(), pc * angle.Sin(), -pitch.Sin() };
	shootz = t1->Center() - t1->Floorclip;

	if (t1->player != NULL)
	{
		shootz += t1->player->mo->AttackZOffset * t1->player->crouchfactor;
		if (damageType == NAME_Melee || damageType == NAME_Hitscan)
		{
			// this is coming from a weapon attack function which needs to transfer information to the obituary code,
			// We need to preserve this info from the damage type because the actual damage type can get overridden by the puff
			pflag = DMG_PLAYERATTACK;
		}
	}
	else
	{
		shootz += 8;
	}

	// We need to check the defaults of the replacement here
	AActor *puffDefaults = GetDefaultByType(pufftype->GetReplacement());
	
	TData.hitGhosts = (t1->player != NULL &&
		t1->player->ReadyWeapon != NULL &&
		(t1->player->ReadyWeapon->flags2 & MF2_THRUGHOST)) ||
		(puffDefaults && (puffDefaults->flags2 & MF2_THRUGHOST));
	
	spawnSky = (puffDefaults && (puffDefaults->flags3 & MF3_SKYEXPLODE));
	TData.MThruSpecies = (puffDefaults && (puffDefaults->flags6 & MF6_MTHRUSPECIES));
	TData.PuffSpecies = NAME_None;

	// [MC] To prevent possible mod breakage, this flag is pretty much necessary.
	// Somewhere, someone is relying on these to spawn on actors and move through them.

	if ((puffDefaults->flags7 & MF7_ALLOWTHRUFLAGS))
	{
		TData.ThruSpecies = (puffDefaults && (puffDefaults->flags6 & MF6_THRUSPECIES));
		TData.ThruActors = (puffDefaults && (puffDefaults->flags2 & MF2_THRUACTORS));

		// [MC] Because this is a one-hit trace event, we need to spawn the puff, get the species
		// and destroy it. Assume there is no species unless tempuff isn't NULL. We cannot get
		// a proper species the same way as puffDefaults flags it appears...

		AActor *tempuff = NULL;
		if (pufftype != NULL)
			tempuff = Spawn(pufftype, t1->Pos(), ALLOW_REPLACE);
		if (tempuff != NULL)
		{
			TData.PuffSpecies = tempuff->GetSpecies();
			tempuff->Destroy();
		}
	}
	else
	{
		TData.ThruSpecies = false;
		TData.ThruActors = false;
	}
	// if the puff uses a non-standard damage type, this will override default, hitscan and melee damage type.
	// All other explicitly passed damage types (currenty only MDK) will be preserved.
	if ((damageType == NAME_None || damageType == NAME_Melee || damageType == NAME_Hitscan) &&
		puffDefaults != NULL && puffDefaults->DamageType != NAME_None)
	{
		damageType = puffDefaults->DamageType;
	}

	int tflags;
	if (nointeract || (puffDefaults && puffDefaults->flags6 & MF6_NOTRIGGER)) tflags = TRACE_NoSky;
	else tflags = TRACE_NoSky | TRACE_Impact;

	if (!Trace(t1->PosAtZ(shootz), t1->Sector, direction, distance, MF_SHOOTABLE, 
		ML_BLOCKEVERYTHING | ML_BLOCKHITSCAN, t1, trace, tflags, CheckForActor, &TData))
	{ // hit nothing
		if (!nointeract && puffDefaults && puffDefaults->ActiveSound)
		{ // Play miss sound
			S_Sound(t1, CHAN_WEAPON, puffDefaults->ActiveSound, 1, ATTN_NORM);
		}

		// [MC] LAF_NOINTERACT guarantees puff spawning and returns it directly to the calling function.
		// No damage caused, no sounds played, no blood splatters.

		if (nointeract || (puffDefaults && puffDefaults->flags3 & MF3_ALWAYSPUFF))
		{ // Spawn the puff anyway
			puff = P_SpawnPuff(t1, pufftype, trace.HitPos, trace.SrcAngleFromTarget, trace.SrcAngleFromTarget, 2, puffFlags);

			if (nointeract)
			{
				return puff;
			}
		}
		else
		{
			return nullptr;
		}
	}
	else
	{
		if (trace.HitType != TRACE_HitActor)
		{
			// position a bit closer for puffs
			if (nointeract || trace.HitType != TRACE_HitWall || ((trace.Line->special != Line_Horizon) || spawnSky))
			{
				DVector2 pos = P_GetOffsetPosition(trace.HitPos.X, trace.HitPos.Y, -trace.HitVector.X * 4, -trace.HitVector.Y * 4);
				puff = P_SpawnPuff(t1, pufftype, DVector3(pos, trace.HitPos.Z - trace.HitVector.Z * 4), trace.SrcAngleFromTarget,
					trace.SrcAngleFromTarget - 90, 0, puffFlags);
				puff->radius = 1/65536.;

				if (nointeract)
				{
					return puff;
				}
			}

			// [RH] Spawn a decal
			if (trace.HitType == TRACE_HitWall && trace.Line->special != Line_Horizon && !trace.Line->isVisualPortal() && !(flags & LAF_NOIMPACTDECAL) && !(puffDefaults->flags7 & MF7_NODECAL))
			{
				// [TN] If the actor or weapon has a decal defined, use that one.
				if (t1->DecalGenerator != NULL ||
					(t1->player != NULL && t1->player->ReadyWeapon != NULL && t1->player->ReadyWeapon->DecalGenerator != NULL))
				{
					// [ZK] If puff has FORCEDECAL set, do not use the weapon's decal
					if (puffDefaults->flags7 & MF7_FORCEDECAL && puff != NULL && puff->DecalGenerator)
						SpawnShootDecal(puff, trace);
					else
						SpawnShootDecal(t1, trace);
				}

				// Else, look if the bulletpuff has a decal defined.
				else if (puff != NULL && puff->DecalGenerator)
				{
					SpawnShootDecal(puff, trace);
				}

				else
				{
					SpawnShootDecal(t1, trace);
				}
			}
			else if (puff != NULL &&
				trace.CrossedWater == NULL &&
				trace.Sector->heightsec == NULL &&
				trace.HitType == TRACE_HitFloor)
			{
				P_HitWater(puff, trace.Sector, trace.HitPos);
			}
		}
		else
		{
			// Hit a thing, so it could be either a puff or blood
			DVector3 bleedpos = trace.HitPos;
			// position a bit closer for puffs/blood if using compatibility mode.
			if (i_compatflags & COMPATF_HITSCAN)
			{
				DVector2 ofs = P_GetOffsetPosition(bleedpos.X, bleedpos.Y, -10 * trace.HitVector.X, -10 * trace.HitVector.Y);
				bleedpos.X = ofs.X;
				bleedpos.Y = ofs.Y;
				bleedpos.Z -= -10 * trace.HitVector.Z;
			}

			// Spawn bullet puffs or blood spots, depending on target type.
			if (nointeract || (puffDefaults && puffDefaults->flags3 & MF3_PUFFONACTORS) ||
				(trace.Actor->flags & MF_NOBLOOD) ||
				(trace.Actor->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
			{
				if (!(trace.Actor->flags & MF_NOBLOOD))
					puffFlags |= PF_HITTHINGBLEED;

				// We must pass the unreplaced puff type here 
				puff = P_SpawnPuff(t1, pufftype, bleedpos, trace.SrcAngleFromTarget, trace.SrcAngleFromTarget - 90, 2, puffFlags | PF_HITTHING, trace.Actor);

				if (nointeract)
				{
					return puff;
				}
			}

			// Allow puffs to inflict poison damage, so that hitscans can poison, too.
			if (puffDefaults != NULL && puffDefaults->PoisonDamage > 0 && puffDefaults->PoisonDuration != INT_MIN)
			{
				P_PoisonMobj(trace.Actor, puff ? puff : t1, t1, puffDefaults->PoisonDamage, puffDefaults->PoisonDuration, puffDefaults->PoisonPeriod, puffDefaults->PoisonDamageType);
			}

			// [GZ] If MF6_FORCEPAIN is set, we need to call P_DamageMobj even if damage is 0!
			// Note: The puff may not yet be spawned here so we must check the class defaults, not the actor.
			int newdam = damage;
			if (damage || (puffDefaults != NULL && ((puffDefaults->flags6 & MF6_FORCEPAIN) || (puffDefaults->flags7 & MF7_CAUSEPAIN))))
			{
				int dmgflags = DMG_INFLICTOR_IS_PUFF | pflag;
				// Allow MF5_PIERCEARMOR on a weapon as well.
				if (t1->player != NULL && (dmgflags & DMG_PLAYERATTACK) && t1->player->ReadyWeapon != NULL &&
					t1->player->ReadyWeapon->flags5 & MF5_PIERCEARMOR)
				{
					dmgflags |= DMG_NO_ARMOR;
				}
				
				if (puff == NULL)
				{
					// Since the puff is the damage inflictor we need it here 
					// regardless of whether it is displayed or not.
					puff = P_SpawnPuff(t1, pufftype, bleedpos, 0., 0., 2, puffFlags | PF_HITTHING | PF_TEMPORARY);
					killPuff = true;
				}
				newdam = P_DamageMobj(trace.Actor, puff ? puff : t1, t1, damage, damageType, dmgflags|DMG_USEANGLE, trace.SrcAngleFromTarget);
				if (actualdamage != NULL)
				{
					*actualdamage = newdam;
				}
			}
			if (!(puffDefaults != NULL && puffDefaults->flags3&MF3_BLOODLESSIMPACT))
			{
				bool bloodsplatter = (t1->flags5 & MF5_BLOODSPLATTER) ||
					(t1->player != nullptr &&	t1->player->ReadyWeapon != nullptr &&
						(t1->player->ReadyWeapon->WeaponFlags & WIF_AXEBLOOD));

				bool axeBlood = (t1->player != nullptr &&
					t1->player->ReadyWeapon != nullptr &&
					(t1->player->ReadyWeapon->WeaponFlags & WIF_AXEBLOOD));

				if (!bloodsplatter && !axeBlood &&
					!(trace.Actor->flags & MF_NOBLOOD) &&
					!(trace.Actor->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
				{
					P_SpawnBlood(bleedpos, trace.SrcAngleFromTarget, newdam > 0 ? newdam : damage, trace.Actor);
				}

				if (damage)
				{
					if (bloodsplatter || axeBlood)
					{
						if (!(trace.Actor->flags&MF_NOBLOOD) &&
							!(trace.Actor->flags2&(MF2_INVULNERABLE | MF2_DORMANT)))
						{
							if (axeBlood)
							{
								P_BloodSplatter2(bleedpos, trace.Actor, trace.SrcAngleFromTarget);
							}
							if (pr_lineattack() < 192)
							{
								P_BloodSplatter(bleedpos, trace.Actor, trace.SrcAngleFromTarget);
							}
						}
					}
					// [RH] Stick blood to walls
					P_TraceBleed(newdam > 0 ? newdam : damage, trace.HitPos, trace.Actor, trace.SrcAngleFromTarget, pitch);
				}
			}
			if (victim != NULL)
			{
				victim->linetarget = trace.Actor;
				victim->attackAngleFromSource = trace.SrcAngleFromTarget;
				// With arbitrary portals this cannot be calculated so using the actual attack angle is the only option.
				victim->angleFromSource = trace.unlinked? victim->attackAngleFromSource : t1->AngleTo(trace.Actor);
				victim->unlinked = trace.unlinked;
			}
		}
		if (trace.Crossed3DWater || trace.CrossedWater)
		{
			if (puff == NULL)
			{ // Spawn puff just to get a mass for the splash
				puff = P_SpawnPuff(t1, pufftype, trace.HitPos, 0., 0., 2, puffFlags | PF_HITTHING | PF_TEMPORARY);
				killPuff = true;
			}
			SpawnDeepSplash(t1, trace, puff);
		}
	}
	if (killPuff && puff != NULL)
	{
		puff->Destroy();
		puff = NULL;
	}
	return puff;
}